

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUniUcs2Little::map
          (CCharmapToUniUcs2Little *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  wchar_t ch;
  size_t sVar1;
  size_t sVar2;
  byte *in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  ulong in_R8;
  size_t csiz;
  wchar_t uni;
  size_t tot_outlen;
  size_t local_30;
  ulong local_28;
  byte *local_20;
  
  local_30 = 0;
  local_20 = in_RCX;
  for (local_28 = in_R8; 1 < local_28; local_28 = local_28 - 2) {
    ch = (uint)*local_20 + (uint)local_20[1] * 0x100;
    sVar1 = utf8_ptr::s_wchar_size(ch);
    local_30 = sVar1 + local_30;
    if (*in_RDX < sVar1) {
      *in_RDX = 0;
    }
    else {
      sVar2 = utf8_ptr::s_putch((char *)*in_RSI,ch);
      *in_RSI = sVar2 + *in_RSI;
      *in_RDX = *in_RDX - sVar1;
    }
    local_20 = local_20 + 2;
  }
  return local_30;
}

Assistant:

size_t CCharmapToUniUcs2Little::map(char **outp, size_t *outlen,
                                    const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte pair) in the input string */
    for ( ; inlen > 1 ; inlen -= 2, inp += 2)
    {
        wchar_t uni;
        size_t csiz;

        /* 
         *   read the little-endian two-byte value - no mapping is
         *   required, since UCS-2 uses the same code point assignments as
         *   UTF-8 
         */
        uni = ((wchar_t)(unsigned char)*inp)
              + (((wchar_t)(unsigned char)*(inp + 1)) << 8);

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);

            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}